

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O1

int MPIX_skewed_kdtree_cart_create
              (MPI_Comm old_comm,int *dims,int num_dims,int *stencil,int stencil_size,int *periods,
              MPI_Comm *cart_comm)

{
  int *factors;
  int *coordinate;
  int iVar1;
  ulong uVar2;
  size_t __nmemb;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  MPI_Comm sorted_comm;
  MPI_Comm tmp;
  int local_60;
  int local_5c;
  int *local_58;
  size_t local_50;
  int *local_48;
  MPI_Comm local_40;
  MPI_Comm local_38;
  
  local_48 = periods;
  mpireorderinglib::MPIX_Node_comm(old_comm,&local_40,(int *)0x0,(int *)0x0,NODES_MEAN);
  __nmemb = (size_t)num_dims;
  factors = (int *)malloc(__nmemb * 8);
  MPI_Comm_size(local_40,&local_5c);
  MPI_Comm_rank(local_40,&local_60);
  local_50 = __nmemb;
  coordinate = (int *)calloc(__nmemb,4);
  local_58 = (int *)malloc(__nmemb * 4);
  memcpy(local_58,dims,__nmemb * 4);
  uVar3 = (ulong)(uint)num_dims;
  if (0 < (int)local_50) {
    uVar2 = 0;
    do {
      factors[uVar2] = 0;
      piVar4 = stencil;
      uVar5 = (ulong)(uint)stencil_size;
      if (0 < stencil_size) {
        do {
          if (*piVar4 != 0) {
            factors[uVar2] = factors[uVar2] + 1;
          }
          piVar4 = piVar4 + uVar3;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar2 = uVar2 + 1;
      stencil = stencil + 1;
    } while (uVar2 != uVar3);
  }
  skewed_find_node_recursive(local_58,num_dims,local_5c,local_60,coordinate,factors);
  iVar1 = *coordinate;
  if (1 < num_dims) {
    uVar2 = 1;
    do {
      iVar1 = iVar1 * dims[uVar2] + coordinate[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  MPI_Comm_split(local_40,0,iVar1,&local_38);
  iVar1 = MPI_Cart_create(local_38,num_dims,dims,local_48,0,cart_comm);
  MPI_Comm_free(&local_38);
  MPI_Comm_free(&local_40);
  free(factors);
  free(local_58);
  free(coordinate);
  return iVar1;
}

Assistant:

int
MPIX_skewed_kdtree_cart_create(MPI_Comm old_comm, const int *dims, int num_dims, const int *stencil, int stencil_size,
                               const int * const periods, MPI_Comm *cart_comm) {
    MPI_Comm sorted_comm;
    mpireorderinglib::MPIX_Node_comm(old_comm, &sorted_comm);
    int *factors = static_cast<int *>(malloc(num_dims * sizeof(double)));
    int world_size;
    MPI_Comm_size(sorted_comm, &world_size);
    int world_rank;
    MPI_Comm_rank(sorted_comm, &world_rank);

    int *coordinate = static_cast<int *>(calloc(num_dims, sizeof(int)));
    int *dims_heper = static_cast<int *>(malloc(num_dims * sizeof(int)));
    memcpy(dims_heper, dims, num_dims * sizeof(int));

    // calculating these factors is only used in the skewed kd-tree variant
    calculate_factors(factors, num_dims, stencil, stencil_size);
    // actual coordinate calculation
    skewed_find_node_recursive(dims_heper, num_dims, world_size, world_rank, coordinate, factors);

    int new_rank = coordinate[0];
    for (int i = 1; i < num_dims; i++) {
        new_rank = new_rank * dims[i] + coordinate[i];
    }

    MPI_Comm tmp;
    MPI_Comm_split(sorted_comm, 0, new_rank, &tmp);
    int err = MPI_Cart_create(tmp, num_dims, dims, periods, 0, cart_comm);
    MPI_Comm_free(&tmp);
    MPI_Comm_free(&sorted_comm);
    free(factors);
    free(dims_heper);
    free(coordinate);
    return err;
}